

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode IDecode(WebPIDecoder *idec)

{
  int *in_RDI;
  VP8Decoder *dec;
  VP8StatusCode status;
  WebPIDecoder *in_stack_00000028;
  WebPIDecoder *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffe8;
  VP8StatusCode VVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  VVar1 = VP8_STATUS_SUSPENDED;
  if (*in_RDI == 0) {
    VVar1 = DecodeWebPHeaders(in_stack_00000048);
  }
  else if (*(long *)(in_RDI + 0x20) == 0) {
    return VP8_STATUS_SUSPENDED;
  }
  if (*in_RDI == 1) {
    VVar1 = DecodeVP8FrameHeader
                      ((WebPIDecoder *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                      );
  }
  if (*in_RDI == 2) {
    VVar1 = DecodePartition0((WebPIDecoder *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  if (*in_RDI == 3) {
    if (*(long *)(in_RDI + 0x20) == 0) {
      return VP8_STATUS_SUSPENDED;
    }
    VVar1 = DecodeRemaining(in_stack_00000028);
  }
  if (*in_RDI == 4) {
    VVar1 = DecodeVP8LHeader((WebPIDecoder *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  if (*in_RDI == 5) {
    VVar1 = DecodeVP8LData((WebPIDecoder *)CONCAT44(VVar1,in_stack_ffffffffffffffe8));
  }
  return VVar1;
}

Assistant:

static VP8StatusCode IDecode(WebPIDecoder* idec) {
  VP8StatusCode status = VP8_STATUS_SUSPENDED;

  if (idec->state_ == STATE_WEBP_HEADER) {
    status = DecodeWebPHeaders(idec);
  } else {
    if (idec->dec_ == NULL) {
      return VP8_STATUS_SUSPENDED;    // can't continue if we have no decoder.
    }
  }
  if (idec->state_ == STATE_VP8_HEADER) {
    status = DecodeVP8FrameHeader(idec);
  }
  if (idec->state_ == STATE_VP8_PARTS0) {
    status = DecodePartition0(idec);
  }
  if (idec->state_ == STATE_VP8_DATA) {
    const VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
    if (dec == NULL) {
      return VP8_STATUS_SUSPENDED;  // can't continue if we have no decoder.
    }
    status = DecodeRemaining(idec);
  }
  if (idec->state_ == STATE_VP8L_HEADER) {
    status = DecodeVP8LHeader(idec);
  }
  if (idec->state_ == STATE_VP8L_DATA) {
    status = DecodeVP8LData(idec);
  }
  return status;
}